

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O2

DdNode * Cudd_addExistAbstract(DdManager *manager,DdNode *f,DdNode *cube)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  
  two = cuddUniqueConst(manager,2.0);
  if (two != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)two & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    iVar2 = addCheckPositiveCube(manager,cube);
    if (iVar2 == 0) {
      fwrite("Error: Can only abstract cubes",0x1e,1,(FILE *)manager->err);
    }
    else {
      do {
        manager->reordered = 0;
        pDVar3 = cuddAddExistAbstractRecur(manager,f,cube);
      } while (manager->reordered == 1);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(manager,two);
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar3;
      }
      Cudd_RecursiveDeref(manager,two);
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addExistAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode *res;

    two = cuddUniqueConst(manager,(CUDD_VALUE_TYPE) 2);
    if (two == NULL) return(NULL);
    cuddRef(two);

    if (addCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,"Error: Can only abstract cubes");
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddAddExistAbstractRecur(manager, f, cube);
    } while (manager->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(manager,two);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(manager,two);
    cuddDeref(res);

    return(res);

}